

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O2

int Aig_ManCountMergeRegs(Aig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  int i;
  Aig_Obj_t *pObj;
  uint uVar5;
  
  Aig_ManIncrementTravId(p);
  uVar4 = 0;
  uVar1 = 0;
  uVar5 = 0;
  for (i = p->nObjs[3] - p->nRegs; i < p->vCos->nSize; i = i + 1) {
    pvVar3 = Vec_PtrEntry(p->vCos,i);
    pObj = (Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe);
    iVar2 = Aig_ObjIsConst1(pObj);
    if (iVar2 != 0) {
      if ((*(byte *)((long)pvVar3 + 8) & 1) == 0) {
        uVar5 = uVar5 + 1;
      }
      else {
        uVar1 = uVar1 + 1;
      }
    }
    if (pObj->TravId != p->nTravIds) {
      pObj->TravId = p->nTravIds;
      uVar4 = uVar4 + 1;
    }
  }
  printf("Regs = %d. Fanins = %d. Const0 = %d. Const1 = %d.\n",(ulong)(uint)p->nRegs,(ulong)uVar4,
         (ulong)uVar1,(ulong)uVar5);
  return 0;
}

Assistant:

int Aig_ManCountMergeRegs( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pFanin;
    int i, Counter = 0, Const0 = 0, Const1 = 0;
    Aig_ManIncrementTravId( p );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsConst1(pFanin) )
        {
            if ( Aig_ObjFaninC0(pObj) )
                Const0++;
            else
                Const1++;
        }
        if ( Aig_ObjIsTravIdCurrent(p, pFanin) )
            continue;
        Aig_ObjSetTravIdCurrent(p, pFanin);
        Counter++;
    }
    printf( "Regs = %d. Fanins = %d. Const0 = %d. Const1 = %d.\n", 
        Aig_ManRegNum(p), Counter, Const0, Const1 );
    return 0;
}